

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unreferenced_variadic.cpp
# Opt level: O3

int main(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_41;
  int local_40 [2];
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> local_20;
  
  local_40[0] = 5;
  __l._M_len = 1;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_20,__l,&local_41);
  if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_40[0] = 5;
  local_40[1] = 6;
  __l_00._M_len = 2;
  __l_00._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,__l_00,&local_41);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
  // expected: no warnings or errors in this code
  add_values(4);
  add_values(4, 1);
  add_values(4, 1, 2);
}